

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O2

void __thiscall duckdb::HLLV1::FromNew(HLLV1 *this,HyperLogLog *new_hll)

{
  byte bVar1;
  idx_t iVar2;
  uint64_t uVar3;
  idx_t iVar4;
  byte bVar5;
  idx_t j;
  ulong uVar6;
  size_t index;
  long lVar7;
  idx_t i;
  long lVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_88;
  double newd;
  
  iVar2 = HyperLogLog::Count(new_hll);
  if (iVar2 != 0) {
    uVar3 = duckdb_hll::num_registers();
    uVar6 = uVar3 >> 6;
    dVar13 = 0.0;
    index = 0;
    for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
      bVar5 = new_hll->k[lVar8];
      bVar1 = duckdb_hll::maximum_zeros();
      if (bVar5 < bVar1) {
        bVar1 = bVar5;
      }
      duckdb_hll::set_register(this->hll,index,bVar1);
      dVar13 = dVar13 + (double)bVar1;
      index = index + uVar6;
    }
    dVar13 = dVar13 * 0.015625;
    if (dVar13 <= 10.0) {
      if (2.0 < dVar13) {
        dVar13 = dVar13 + -2.0;
      }
    }
    else {
      dVar13 = dVar13 * 0.75;
    }
    auVar11._0_8_ = (double)CONCAT44(0x43300000,(int)iVar2);
    auVar11._8_4_ = (int)(iVar2 >> 0x20);
    auVar11._12_4_ = 0x45300000;
    dVar14 = (auVar11._8_8_ - 1.9342813113834067e+25) + (auVar11._0_8_ - 4503599627370496.0);
    local_88 = 0.0;
    lVar8 = 0;
    while (lVar8 != 5) {
      iVar4 = Count(this);
      auVar12._8_4_ = (int)(iVar4 >> 0x20);
      auVar12._0_8_ = iVar4;
      auVar12._12_4_ = 0x45300000;
      dVar15 = (auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)iVar4) - 4503599627370496.0);
      dVar16 = dVar14;
      if (dVar14 <= dVar15) {
        dVar16 = dVar15;
      }
      dVar17 = dVar14;
      if (dVar15 <= dVar14) {
        dVar17 = dVar15;
      }
      if (dVar16 / dVar17 < 1.2) {
        return;
      }
      lVar8 = lVar8 + 1;
      dVar16 = dVar13 / (double)(1 << ((byte)lVar8 & 0x1f));
      iVar4 = Count(this);
      if (iVar2 < iVar4) {
        local_88 = (double)(~-(ulong)(local_88 < dVar16) & (ulong)(local_88 - dVar16));
      }
      else {
        local_88 = local_88 + dVar16;
      }
      dVar16 = floor(local_88);
      dVar15 = ceil(local_88);
      lVar7 = 0;
      for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
        bVar5 = new_hll->k[lVar9];
        bVar1 = duckdb_hll::maximum_zeros();
        if (bVar5 < bVar1) {
          bVar1 = bVar5;
        }
        uVar10 = -(ulong)((double)lVar9 * 0.015625 < (dVar16 - local_88) + 1.0);
        bVar5 = (byte)(int)(double)(~uVar10 & (ulong)dVar15 | uVar10 & (ulong)dVar16);
        if (bVar5 < bVar1) {
          bVar1 = bVar5;
        }
        for (uVar10 = 1; uVar10 < uVar6; uVar10 = uVar10 + 1) {
          duckdb_hll::set_register(this->hll,uVar10 + lVar7,bVar1);
        }
        lVar7 = lVar7 + uVar6;
      }
    }
  }
  return;
}

Assistant:

void FromNew(const HyperLogLog &new_hll) {
		const auto new_hll_count = new_hll.Count();
		if (new_hll_count == 0) {
			return;
		}

		const idx_t mult = duckdb_hll::num_registers() / HyperLogLog::M;
		// When going from less to more registers, we cannot just duplicate the registers,
		// as each register in the new HLL is the minimum of 'mult' registers in the old HLL.
		// Duplicating will make for VERY large over-estimations. Instead, we do the following:

		// Set the first of every 'mult' registers in the old HLL to the value in the new HLL
		// This ensures that we can convert NEW to OLD and back to NEW without loss of information
		double avg = 0;
		for (idx_t i = 0; i < HyperLogLog::M; i++) {
			const auto max_new = MinValue(new_hll.GetRegister(i), duckdb_hll::maximum_zeros());
			duckdb_hll::set_register(hll, i * mult, max_new);
			avg += static_cast<double>(max_new);
		}
		avg /= static_cast<double>(HyperLogLog::M);

		// Using the average will ALWAYS overestimate, so we reduce it a bit here
		if (avg > 10) {
			avg *= 0.75;
		} else if (avg > 2) {
			avg -= 2;
		}

		// Set all other registers to a default value, starting with 0 (the initialization value)
		// We optimize the default value in 5 iterations or until OLD count is close to NEW count
		double default_val = 0;
		for (idx_t opt_idx = 0; opt_idx < 5; opt_idx++) {
			if (IsWithinAcceptableRange(new_hll_count, Count())) {
				break;
			}

			// Delta is half the average, then a quarter, etc.
			const double delta = avg / static_cast<double>(1 << (opt_idx + 1));
			if (Count() > new_hll_count) {
				default_val = delta > default_val ? 0 : default_val - delta;
			} else {
				default_val += delta;
			}

			// If the default value is, e.g., 3.3, then the first 70% gets value 3, and the rest gets value 4
			const double floor_fraction = 1 - (default_val - floor(default_val));
			for (idx_t i = 0; i < HyperLogLog::M; i++) {
				const auto max_new = MinValue(new_hll.GetRegister(i), duckdb_hll::maximum_zeros());
				uint8_t register_value;
				if (static_cast<double>(i) / static_cast<double>(HyperLogLog::M) < floor_fraction) {
					register_value = ExactNumericCast<uint8_t>(floor(default_val));
				} else {
					register_value = ExactNumericCast<uint8_t>(ceil(default_val));
				}
				register_value = MinValue(register_value, max_new);
				for (idx_t j = 1; j < mult; j++) {
					D_ASSERT(i * mult + j < duckdb_hll::num_registers());
					duckdb_hll::set_register(hll, i * mult + j, register_value);
				}
			}
		}
	}